

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpacking.cpp
# Opt level: O3

void duckdb_fastpforlib::internal::Unroller<(unsigned_short)56,_(unsigned_short)2>::Unpack
               (uint32_t **in,uint64_t *out)

{
  uint uVar1;
  uint32_t *puVar2;
  
  puVar2 = *in;
  uVar1 = puVar2[2];
  out[2] = (ulong)(uVar1 & 0xff) << 0x30 | (ulong)*(uint6 *)((long)puVar2 + 2);
  out[3] = (ulong)puVar2[3] << 0x18 | (ulong)(uVar1 >> 8);
  *in = puVar2 + 4;
  Unroller<(unsigned_short)56,_(unsigned_short)4>::Unpack(in,out);
  return;
}

Assistant:

unpack_single_out(const uint32_t *__restrict &in,
                                                                     uint64_t *__restrict out) {
	*out = static_cast<uint64_t>(*in) >> SHR;
	++in;

	*out |= static_cast<uint64_t>(*in) << (32 - SHR);
	++in;

	if (DELTA + SHR > 64) {
		static const uint8_t NEXT_SHR = DELTA + SHR - 64;
		*out |= static_cast<uint64_t>((*in) % (1U << NEXT_SHR)) << (64 - SHR);
	}
}